

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_zip_entry_close(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_value *pObj;
  jx9_real jVar2;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar1 = ((*apArg)->x).iVal, lVar1 == 0)
      ) || (*(int *)(lVar1 + 0xa0) != -0x21529ca6)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive entry");
    jVar2 = 0.0;
  }
  else {
    *(undefined4 *)(lVar1 + 8) = 0;
    jVar2 = 4.94065645841247e-324;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar2;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_close(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Reset the read cursor */
	pEntry->nReadCount = 0;
	/*All done. Actually this function is a no-op, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}